

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O2

void __thiscall cursespp::ScrollableWindow::ProcessMouseEvent(ScrollableWindow *this)

{
  Event *in_RSI;
  
  ProcessMouseEvent((ScrollableWindow *)&this[-1].scrollPosition.logicalIndex,in_RSI);
  return;
}

Assistant:

bool ScrollableWindow::ProcessMouseEvent(const IMouseHandler::Event& event) {
    const bool result = Window::ProcessMouseEvent(event);

    if (event.Button1Clicked()) {
        this->FocusInParent();
        return true;
    }
    else if (event.MouseWheelDown()) {
        this->PageDown();
        return true;
    }
    else if (event.MouseWheelUp()) {
        this->PageUp();
        return true;
    }

    return result;
}